

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map2json.c
# Opt level: O3

map2json_t * map2json_init(char *prefix)

{
  map2json_t *pmVar1;
  csafestring_t *pcVar2;
  
  pmVar1 = (map2json_t *)malloc(0x20);
  pcVar2 = safe_create((char *)0x0);
  pmVar1->buffer = pcVar2;
  pmVar1->pairs = (map2json_keyvalue_t *)0x0;
  pmVar1->tree = (map2json_tree_t *)0x0;
  pmVar1->prefix = prefix;
  return pmVar1;
}

Assistant:

map2json_t *map2json_init(char *prefix) {
	DEBUG_TEXT("map2json_init(%s)... ", prefix);
	map2json_t *obj;

	obj = (map2json_t *) malloc(sizeof(map2json_t));
	obj->buffer = safe_create(NULL);
	obj->pairs = NULL;
	obj->tree = NULL;
	obj->prefix = prefix;

	DEBUG_TEXT("map2json_init(%s)... DONE", prefix);
	return obj;
}